

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeNode.h
# Opt level: O0

void __thiscall
TreeNode<ActionObservationHistory>::~TreeNode(TreeNode<ActionObservationHistory> *this)

{
  void *in_RDI;
  TreeNode<ActionObservationHistory> *in_stack_00000020;
  
  ~TreeNode(in_stack_00000020);
  operator_delete(in_RDI,0x58);
  return;
}

Assistant:

virtual ~TreeNode()
        {
#if DEBUG_TREENODE
            cerr << "Deleting TreeNode. This node ";
            PrintThisNode();cerr << endl;
#endif
            delete(_m_containedElem);

            while(!_m_successor.empty())
            {
                delete _m_successor.begin()->second; // recursively
                                                     // delete the
                                                     // rest of the
                                                     // tree
                _m_successor.erase(_m_successor.begin());
            }
        }